

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O0

bool testExtendAndPrepend<CyclicHash<unsigned_int,unsigned_char>>(uint L)

{
  undefined4 uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end;
  ostream *poVar6;
  void *pvVar7;
  uchar *puVar8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_548;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_540;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_538;
  const_iterator j;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_528;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_520;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_518;
  undefined1 local_510 [8];
  string prepend;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4e0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d8;
  undefined1 local_4d0 [8];
  string extend;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_498;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_490;
  undefined1 local_488 [8];
  string base;
  allocator local_451;
  string local_450 [8];
  string input;
  CyclicHash<unsigned_int,_unsigned_char> hf;
  uint n;
  uint L_local;
  
  CyclicHash<unsigned_int,_unsigned_char>::CyclicHash
            ((CyclicHash<unsigned_int,_unsigned_char> *)((long)&input.field_2 + 0xc),4,L);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"XABCDY",&local_451);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  local_498._M_current = (char *)std::__cxx11::string::begin();
  local_490 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator+(&local_498,1);
  local_4a8._M_current = (char *)std::__cxx11::string::end();
  local_4a0 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator-(&local_4a8,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((string *)local_488,local_490,local_4a0,
             (allocator<char> *)(extend.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(extend.field_2._M_local_buf + 0xf));
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 4) {
    __assert_fail("base.size() == n",
                  "/workspace/llm4binary/github/license_c_cmakelists/lemire[P]rollinghashcpp/tests/unit.cpp"
                  ,0x11,"bool testExtendAndPrepend(uint) [hashfunction = CyclicHash<>]");
  }
  local_4e0._M_current = (char *)std::__cxx11::string::begin();
  local_4d8 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator+(&local_4e0,1);
  __end._M_current = (char *)std::__cxx11::string::end();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((string *)local_4d0,local_4d8,__end,
             (allocator<char> *)(prepend.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(prepend.field_2._M_local_buf + 0xf));
  local_518._M_current = (char *)std::__cxx11::string::begin();
  local_528._M_current = (char *)std::__cxx11::string::end();
  local_520 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator-(&local_528,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((string *)local_510,local_518,local_520,(allocator<char> *)((long)&j._M_current + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&j._M_current + 7));
  local_540._M_current = (char *)std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_538,&local_540);
  while( true ) {
    local_548._M_current = (char *)std::__cxx11::string::end();
    bVar2 = __gnu_cxx::operator!=(&local_538,&local_548);
    uVar1 = input.field_2._12_4_;
    if (!bVar2) break;
    puVar8 = (uchar *)__gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&local_538);
    CyclicHash<unsigned_int,_unsigned_char>::eat
              ((CyclicHash<unsigned_int,_unsigned_char> *)((long)&input.field_2 + 0xc),*puVar8);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_538);
  }
  uVar3 = CyclicHash<unsigned_int,unsigned_char>::hash<std::__cxx11::string>
                    ((CyclicHash<unsigned_int,unsigned_char> *)(input.field_2._M_local_buf + 0xc),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488)
  ;
  if (uVar1 == uVar3) {
    puVar8 = (uchar *)std::__cxx11::string::operator[]((ulong)local_450);
    uVar3 = CyclicHash<unsigned_int,_unsigned_char>::hash_prepend
                      ((CyclicHash<unsigned_int,_unsigned_char> *)((long)&input.field_2 + 0xc),
                       *puVar8);
    uVar4 = CyclicHash<unsigned_int,unsigned_char>::hash<std::__cxx11::string>
                      ((CyclicHash<unsigned_int,unsigned_char> *)(input.field_2._M_local_buf + 0xc),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_510);
    if (uVar3 == uVar4) {
      puVar8 = (uchar *)std::__cxx11::string::back();
      uVar3 = CyclicHash<unsigned_int,_unsigned_char>::hash_extend
                        ((CyclicHash<unsigned_int,_unsigned_char> *)((long)&input.field_2 + 0xc),
                         *puVar8);
      uVar4 = CyclicHash<unsigned_int,unsigned_char>::hash<std::__cxx11::string>
                        ((CyclicHash<unsigned_int,unsigned_char> *)
                         (input.field_2._M_local_buf + 0xc),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4d0);
      if (uVar3 == uVar4) {
        uVar3 = CyclicHash<unsigned_int,unsigned_char>::hash<std::__cxx11::string>
                          ((CyclicHash<unsigned_int,unsigned_char> *)
                           (input.field_2._M_local_buf + 0xc),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_488);
        if (input.field_2._12_4_ != uVar3) {
          __assert_fail("hf.hashvalue == hf.hash(base)",
                        "/workspace/llm4binary/github/license_c_cmakelists/lemire[P]rollinghashcpp/tests/unit.cpp"
                        ,0x2a,"bool testExtendAndPrepend(uint) [hashfunction = CyclicHash<>]");
        }
        puVar8 = (uchar *)std::__cxx11::string::operator[]((ulong)local_450);
        uVar3 = CyclicHash<unsigned_int,_unsigned_char>::hash_prepend
                          ((CyclicHash<unsigned_int,_unsigned_char> *)((long)&input.field_2 + 0xc),
                           *puVar8);
        uVar4 = CyclicHash<unsigned_int,unsigned_char>::hash<std::__cxx11::string>
                          ((CyclicHash<unsigned_int,unsigned_char> *)
                           (input.field_2._M_local_buf + 0xc),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_510);
        if (uVar3 != uVar4) {
          __assert_fail("hf.hash_prepend(input[0]) == hf.hash(prepend)",
                        "/workspace/llm4binary/github/license_c_cmakelists/lemire[P]rollinghashcpp/tests/unit.cpp"
                        ,0x2b,"bool testExtendAndPrepend(uint) [hashfunction = CyclicHash<>]");
        }
        puVar8 = (uchar *)std::__cxx11::string::back();
        uVar3 = CyclicHash<unsigned_int,_unsigned_char>::hash_extend
                          ((CyclicHash<unsigned_int,_unsigned_char> *)((long)&input.field_2 + 0xc),
                           *puVar8);
        uVar4 = CyclicHash<unsigned_int,unsigned_char>::hash<std::__cxx11::string>
                          ((CyclicHash<unsigned_int,unsigned_char> *)
                           (input.field_2._M_local_buf + 0xc),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4d0);
        if (uVar3 != uVar4) {
          __assert_fail("hf.hash_extend(input.back()) == hf.hash(extend)",
                        "/workspace/llm4binary/github/license_c_cmakelists/lemire[P]rollinghashcpp/tests/unit.cpp"
                        ,0x2c,"bool testExtendAndPrepend(uint) [hashfunction = CyclicHash<>]");
        }
        n._3_1_ = true;
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cout,"bug!");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<((ostream *)&std::cout,(string *)local_4d0);
        poVar6 = std::operator<<(poVar6," ");
        puVar8 = (uchar *)std::__cxx11::string::back();
        uVar3 = CyclicHash<unsigned_int,_unsigned_char>::hash_extend
                          ((CyclicHash<unsigned_int,_unsigned_char> *)((long)&input.field_2 + 0xc),
                           *puVar8);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar3);
        poVar6 = std::operator<<(poVar6," ");
        uVar3 = CyclicHash<unsigned_int,unsigned_char>::hash<std::__cxx11::string>
                          ((CyclicHash<unsigned_int,unsigned_char> *)
                           (input.field_2._M_local_buf + 0xc),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4d0);
        pvVar7 = (void *)std::ostream::operator<<(poVar6,uVar3);
        std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
        n._3_1_ = false;
      }
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cout,"bug!");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cout,(string *)local_510);
      poVar6 = std::operator<<(poVar6," ");
      puVar8 = (uchar *)std::__cxx11::string::operator[]((ulong)local_450);
      uVar3 = CyclicHash<unsigned_int,_unsigned_char>::hash_prepend
                        ((CyclicHash<unsigned_int,_unsigned_char> *)((long)&input.field_2 + 0xc),
                         *puVar8);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar3);
      poVar6 = std::operator<<(poVar6," ");
      uVar3 = CyclicHash<unsigned_int,unsigned_char>::hash<std::__cxx11::string>
                        ((CyclicHash<unsigned_int,unsigned_char> *)
                         (input.field_2._M_local_buf + 0xc),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_510);
      pvVar7 = (void *)std::ostream::operator<<(poVar6,uVar3);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      n._3_1_ = false;
    }
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"bug!");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<((ostream *)&std::cout,(string *)local_488);
    poVar6 = std::operator<<(poVar6," ");
    uVar3 = CyclicHash<unsigned_int,unsigned_char>::hash<std::__cxx11::string>
                      ((CyclicHash<unsigned_int,unsigned_char> *)(input.field_2._M_local_buf + 0xc),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_488);
    pvVar7 = (void *)std::ostream::operator<<(poVar6,uVar3);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    n._3_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_510);
  std::__cxx11::string::~string((string *)local_4d0);
  std::__cxx11::string::~string((string *)local_488);
  std::__cxx11::string::~string(local_450);
  return n._3_1_;
}

Assistant:

bool testExtendAndPrepend(uint L = 19) {
  const uint n(4); // n-grams
  hashfunction hf(n, L);
  string input = "XABCDY";
  string base(input.begin() + 1, input.end() - 1);
  assert(base.size() == n);
  string extend(input.begin() + 1, input.end());
  string prepend(input.begin(), input.end() - 1);

  for (string::const_iterator j = base.begin(); j != base.end(); ++j) {
    hf.eat(*j);
  }
  if (hf.hashvalue != hf.hash(base)) {
    std::cout << "bug!" << std::endl;
    std::cout << base << " " << hf.hash(base) << std::endl;
    return false;
  }
  if (hf.hash_prepend(input[0]) != hf.hash(prepend)) {
    std::cout << "bug!" << std::endl;
    std::cout << prepend << " " << hf.hash_prepend(input[0]) << " "
              << hf.hash(prepend) << std::endl;
    return false;
  }
  if (hf.hash_extend(input.back()) != hf.hash(extend)) {
    std::cout << "bug!" << std::endl;
    std::cout << extend << " " << hf.hash_extend(input.back()) << " "
              << hf.hash(extend) << std::endl;
    return false;
  }

  assert(hf.hashvalue == hf.hash(base));
  assert(hf.hash_prepend(input[0]) == hf.hash(prepend));
  assert(hf.hash_extend(input.back()) == hf.hash(extend));

  return true;
}